

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O2

int cinatra::detail::phr_parse_response
              (char *buf_start,size_t len,int *minor_version,int *status,char **msg,size_t *msg_len,
              http_header *headers,size_t *num_headers,size_t last_len)

{
  size_t max_headers;
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int r;
  
  r = (int)((ulong)in_RAX >> 0x20);
  max_headers = *num_headers;
  *minor_version = -1;
  *status = 0;
  *msg = (char *)0x0;
  pcVar3 = buf_start + len;
  *msg_len = 0;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar4 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar4 = buf_start;
    }
    iVar2 = 0;
    do {
      if (pcVar4 == pcVar3) {
        return -2;
      }
      pcVar5 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_00121e8f:
        iVar1 = iVar2 + 1;
      }
      else {
        iVar1 = 0;
        if (*pcVar4 == '\r') {
          if (pcVar5 == pcVar3) {
            return -2;
          }
          if (*pcVar5 != '\n') {
            return -1;
          }
          pcVar5 = pcVar4 + 2;
          goto LAB_00121e8f;
        }
      }
      iVar2 = iVar1;
      pcVar4 = pcVar5;
    } while (iVar2 != 2);
  }
  pcVar3 = parse_response(buf_start,pcVar3,minor_version,status,msg,msg_len,headers,num_headers,
                          max_headers,&r);
  if (pcVar3 != (char *)0x0) {
    r = (int)pcVar3 - (int)buf_start;
  }
  return r;
}

Assistant:

inline int phr_parse_response(const char *buf_start, size_t len,
                              int *minor_version, int *status, const char **msg,
                              size_t *msg_len, http_header *headers,
                              size_t *num_headers, size_t last_len) {
  const char *buf = buf_start, *buf_end = buf + len;
  size_t max_headers = *num_headers;
  int r;

  *minor_version = -1;
  *status = 0;
  *msg = NULL;
  *msg_len = 0;
  *num_headers = 0;

  /* if last_len != 0, check if the response is complete (a fast countermeasure
  against slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len,
                            headers, num_headers, max_headers, &r)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start);
}